

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderLimitsRenderingBase::iterate(GeometryShaderLimitsRenderingBase *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  char *description;
  GLenum primitive_type;
  GLuint n_vertices;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_image;
  undefined4 local_30;
  undefined4 local_2c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  long lVar3;
  
  initTest(this);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
             (ulong)(this->m_texture_height * this->m_texture_width * this->m_texture_pixel_size),
             (allocator_type *)&local_30);
  (**(code **)(lVar3 + 0x1680))(this->m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x476);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(this);
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar3 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x47e);
  local_30 = 0;
  local_2c = 1;
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  (**(code **)(lVar3 + 0x538))(local_30,0,local_2c);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x487);
  (**(code **)(lVar3 + 0x1220))
            (0,0,this->m_texture_width,this->m_texture_height,this->m_texture_read_format,
             this->m_texture_read_type,local_28._M_impl.super__Vector_impl_data._M_start);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x48d);
  iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                    (this,local_28._M_impl.super__Vector_impl_data._M_start);
  description = "Fail";
  if ((byte)iVar1 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(byte)((byte)iVar1 ^ 1),description);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderLimitsRenderingBase::iterate()
{
	initTest();

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Variables used for image verification purposes */
	std::vector<unsigned char> result_image(m_texture_width * m_texture_height * m_texture_pixel_size);

	/* Render */
	gl.useProgram(m_program_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	/* Let child class prepare input for program */
	prepareProgramInput();

	gl.clearColor(0 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	/* Get draw call details from child class */
	glw::GLenum primitive_type = GL_POINTS;
	glw::GLuint n_vertices	 = 1;

	getDrawCallDetails(primitive_type, n_vertices);

	gl.drawArrays(primitive_type, 0 /* first */, n_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");

	/* Extract image from FBO */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, m_texture_read_format, m_texture_read_type,
				  &result_image[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* Run verification */
	if (true == verifyResult(&result_image[0]))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Let child class clean itself */
	clean();

	return STOP;
}